

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverListenerAdapter.h
# Opt level: O3

int __thiscall
aeron::DriverListenerAdapter<aeron::ClientConductor>::receiveMessages
          (DriverListenerAdapter<aeron::ClientConductor> *this)

{
  int iVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(int,_aeron::concurrent::AtomicBuffer_&,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/DriverListenerAdapter.h:50:13)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(int,_aeron::concurrent::AtomicBuffer_&,_int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/DriverListenerAdapter.h:50:13)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  iVar1 = concurrent::broadcast::CopyBroadcastReceiver::receive
                    (this->m_broadcastReceiver,(handler_t *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return iVar1;
}

Assistant:

int receiveMessages()
    {
        return m_broadcastReceiver.receive(
            [&](std::int32_t msgTypeId, AtomicBuffer& buffer, util::index_t offset, util::index_t length)
            {
                switch (msgTypeId)
                {
                    case ControlProtocolEvents::ON_PUBLICATION_READY:
                    {
                        const PublicationBuffersReadyFlyweight publicationReady(buffer, offset);

                        m_driverListener.onNewPublication(
                            publicationReady.streamId(),
                            publicationReady.sessionId(),
                            publicationReady.positionLimitCounterId(),
                            publicationReady.channelStatusIndicatorId(),
                            publicationReady.logFileName(),
                            publicationReady.correlationId(),
                            publicationReady.registrationId());
                        break;
                    }

                    case ControlProtocolEvents::ON_EXCLUSIVE_PUBLICATION_READY:
                    {
                        const PublicationBuffersReadyFlyweight publicationReady(buffer, offset);

                        m_driverListener.onNewExclusivePublication(
                            publicationReady.streamId(),
                            publicationReady.sessionId(),
                            publicationReady.positionLimitCounterId(),
                            publicationReady.channelStatusIndicatorId(),
                            publicationReady.logFileName(),
                            publicationReady.correlationId(),
                            publicationReady.registrationId());
                        break;
                    }

                    case ControlProtocolEvents::ON_SUBSCRIPTION_READY:
                    {
                        const SubscriptionReadyFlyweight subscriptionReady(buffer, offset);

                        m_driverListener.onSubscriptionReady(
                            subscriptionReady.correlationId(),
                            subscriptionReady.channelStatusIndicatorId());
                        break;
                    }

                    case ControlProtocolEvents::ON_AVAILABLE_IMAGE:
                    {
                        const ImageBuffersReadyFlyweight imageReady(buffer, offset);

                        m_driverListener.onAvailableImage(
                            imageReady.streamId(),
                            imageReady.sessionId(),
                            imageReady.logFileName(),
                            imageReady.sourceIdentity(),
                            imageReady.subscriberPositionId(),
                            imageReady.subscriberRegistrationId(),
                            imageReady.correlationId());
                        break;
                    }

                    case ControlProtocolEvents::ON_OPERATION_SUCCESS:
                    {
                        const OperationSucceededFlyweight operationSucceeded(buffer, offset);

                        m_driverListener.onOperationSuccess(operationSucceeded.correlationId());
                        break;
                    }

                    case ControlProtocolEvents::ON_UNAVAILABLE_IMAGE:
                    {
                        const ImageMessageFlyweight imageMessage(buffer, offset);

                        m_driverListener.onUnavailableImage(
                            imageMessage.streamId(),
                            imageMessage.correlationId(),
                            imageMessage.subscriptionRegistrationId());
                        break;
                    }

                    case ControlProtocolEvents::ON_ERROR:
                    {
                        const ErrorResponseFlyweight errorResponse(buffer, offset);

                        m_driverListener.onErrorResponse(
                            errorResponse.offendingCommandCorrelationId(),
                            errorResponse.errorCode(),
                            errorResponse.errorMessage());
                        break;
                    }

                    case ControlProtocolEvents::ON_COUNTER_READY:
                    {
                        const CounterUpdateFlyweight response(buffer, offset);

                        m_driverListener.onAvailableCounter(response.correlationId(), response.counterId());
                        break;
                    }

                    case ControlProtocolEvents::ON_UNAVAILABLE_COUNTER:
                    {
                        const CounterUpdateFlyweight response(buffer, offset);

                        m_driverListener.onUnavailableCounter(response.correlationId(), response.counterId());
                        break;
                    }

                    case ControlProtocolEvents::ON_CLIENT_TIMEOUT:
                    {
                        const ClientTimeoutFlyweight response(buffer, offset);

                        m_driverListener.onClientTimeout(response.clientId());
                        break;
                    }

                    default:
                        break;
                }
            });
    }